

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lexer.cpp
# Opt level: O0

Token * __thiscall Lexer::readLineTerminator(Token *__return_storage_ptr__,Lexer *this)

{
  Lexer *this_local;
  Token *token;
  
  Token::Token(__return_storage_ptr__,LineTerminatorToken);
  return __return_storage_ptr__;
}

Assistant:

Token Lexer::readLineTerminator() {
    Token token{Token::LineTerminatorToken};
    return token;
}